

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O2

int append_to_zip(FILE *zip_file,file_sorted_t *filep,FILE *ozip,BYTE *odir)

{
  undefined1 *__filename;
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  file_entry_t *file;
  code *pcVar5;
  FILE *__stream;
  uint uVar6;
  int iVar7;
  tm *time;
  FILE *__stream_00;
  ulong uVar8;
  void *__ptr;
  size_t sVar9;
  undefined8 uVar10;
  CentralDirectoryEntry *ent;
  Byte *__ptr_00;
  Byte *__ptr_01;
  int *piVar11;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  uint *puVar15;
  ulong __size;
  long lVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  uint comp_len [2];
  Byte *compbuf [2];
  int method [2];
  int offset [2];
  undefined4 local_50;
  undefined2 local_4c;
  short local_4a;
  short local_48;
  undefined4 local_46;
  uint local_42;
  uint local_3e;
  uint local_3a;
  undefined2 local_36;
  undefined2 local_34;
  
  file = filep->file;
  time = localtime(&file->time_write);
  time_to_dos((tm *)time,&file->date,&file->time);
  __filename = &file->field_0x26;
  __stream_00 = fopen(__filename,"rb");
  __stream = _stderr;
  if (__stream_00 == (FILE *)0x0) {
    piVar11 = __errno_location();
    pcVar14 = strerror(*piVar11);
    fprintf(__stream,"Could not open %s: %s\n",__filename,pcVar14);
    return 1;
  }
  fseek(__stream_00,0,2);
  uVar8 = ftell(__stream_00);
  fseek(__stream_00,0,0);
  uVar12 = (uint)uVar8;
  __size = uVar8 & 0xffffffff;
  __ptr = malloc(__size);
  if (__ptr == (void *)0x0) {
    fclose(__stream_00);
    fprintf(_stderr,"Could not allocate %u bytes\n",uVar8 & 0xffffffff);
    return 1;
  }
  sVar9 = fread(__ptr,1,__size,__stream_00);
  fclose(__stream_00);
  if ((uint)sVar9 == uVar12) {
    file->uncompressed_size = uVar12;
    file->compressed_size = uVar12;
    file->method = 0;
    uVar10 = crc32(0,0,0);
    uVar6 = crc32(uVar10,__ptr,uVar8 & 0xffffffff);
    file->crc32 = uVar6;
    if ((ozip != (FILE *)0x0 && odir != (BYTE *)0x0) &&
       (ent = find_file_in_zip(odir,filep->path_in_zip,uVar12,uVar6,0,0),
       ent != (CentralDirectoryEntry *)0x0)) {
      iVar7 = copy_zip_file(zip_file,file,ozip,ent);
      if (0 < iVar7) {
        free(__ptr);
        return 0;
      }
      if (iVar7 < 0) {
        free(__ptr);
        pcVar14 = "Unable to write %s to zip\n";
        goto LAB_001040e6;
      }
    }
    if (Quiet == 0) {
      pcVar14 = "Adding %-40s";
      if (ozip != (FILE *)0x0) {
        pcVar14 = "Updating %-40s";
      }
      printf(pcVar14,filep->path_in_zip);
    }
    UpdateCount = UpdateCount + 1;
    uVar12 = uVar12 - 1;
    __ptr_00 = (Byte *)malloc((ulong)uVar12);
    compbuf[0] = __ptr_00;
    __ptr_01 = (Byte *)malloc((ulong)uVar12);
    compbuf[1] = __ptr_01;
    uVar6 = 0xffffffff;
    uVar13 = 0;
    for (lVar16 = 8; lVar16 != 0x38; lVar16 = lVar16 + 0x10) {
      pcVar5 = *(code **)((long)&__do_global_dtors_aux_fini_array_entry + lVar16);
      iVar7 = *(int *)((long)&Compressors[0].compress + lVar16);
      if ((DeflateOnly == 0) || (bVar17 = iVar7 == 8, iVar7 = 8, bVar17)) {
        puVar15 = comp_len + uVar13;
        *puVar15 = uVar12;
        method[uVar13] = iVar7;
        iVar7 = (*pcVar5)(compbuf[uVar13],puVar15,__ptr,uVar8);
        offset[uVar13] = iVar7;
        if ((-1 < iVar7) && (((int)uVar6 < 0 || (*puVar15 <= comp_len[uVar6])))) {
          uVar6 = uVar13;
          uVar13 = uVar13 ^ 1;
        }
      }
    }
    if ((int)uVar6 < 0) {
      local_48 = file->method;
      local_3e = file->compressed_size;
    }
    else {
      local_48 = (short)method[uVar6];
      file->method = local_48;
      local_3e = comp_len[uVar6];
      file->compressed_size = local_3e;
    }
    local_50 = 0x4034b50;
    local_4c = 0x14;
    local_4a = (ushort)(local_48 == 8) * 2;
    uVar1 = file->date;
    uVar2 = file->time;
    uVar3 = file->method;
    uVar4 = *(undefined2 *)&file->field_0x26;
    auVar18._6_2_ = uVar4;
    auVar18._4_2_ = uVar3;
    auVar18._2_2_ = uVar2;
    auVar18._0_2_ = uVar1;
    auVar18._8_8_ = 0;
    auVar18 = pshuflw(auVar18,auVar18,0xe1);
    local_46 = auVar18._0_4_;
    local_42 = file->crc32;
    local_3a = file->uncompressed_size;
    sVar9 = strlen(filep->path_in_zip);
    local_36 = (undefined2)sVar9;
    local_34 = 0;
    lVar16 = ftell((FILE *)zip_file);
    file->zip_offset = (uint)lVar16;
    sVar9 = fwrite(&local_50,0x1e,1,(FILE *)zip_file);
    if (sVar9 == 1) {
      pcVar14 = filep->path_in_zip;
      sVar9 = strlen(pcVar14);
      sVar9 = fwrite(pcVar14,sVar9,1,(FILE *)zip_file);
      if (sVar9 == 1) {
        if (file->method == 0) {
          sVar9 = fwrite(__ptr,1,__size,(FILE *)zip_file);
          if (sVar9 == __size) goto LAB_00103f89;
        }
        else {
          sVar9 = fwrite(compbuf[(int)uVar6] + offset[(int)uVar6],1,(ulong)comp_len[(int)uVar6],
                         (FILE *)zip_file);
          if (sVar9 == comp_len[(int)uVar6]) {
LAB_00103f89:
            free(__ptr);
            free(__ptr_00);
            free(__ptr_01);
            if (Quiet == 0) {
              uVar12 = file->compressed_size;
              uVar6 = file->uncompressed_size;
              pcVar14 = method_name((int)file->method);
              printf("%5.1f%% [%6u/%6u] %s\n",100.0 - ((double)uVar12 * 100.0) / (double)uVar6,
                     (ulong)uVar12,(ulong)uVar6,pcVar14);
              return 0;
            }
            return 0;
          }
        }
      }
    }
    if (Quiet == 0) {
      putchar(10);
    }
    fprintf(_stderr,"Unable to write %s to zip\n",__filename);
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
  }
  else {
    free(__ptr);
    pcVar14 = "Unable to read %s\n";
LAB_001040e6:
    fprintf(_stderr,pcVar14,__filename);
  }
  return 1;
}

Assistant:

int append_to_zip(FILE *zip_file, file_sorted_t *filep, FILE *ozip, BYTE *odir)
{
	LocalFileHeader local;
	uLong crc;
	file_entry_t *file;
	Byte *readbuf;
	Byte *compbuf[2];
	unsigned int comp_len[2];
	int offset[2];
	int method[2];
	int best;
	int slot;
	FILE *lumpfile;
	unsigned int readlen;
	unsigned int len;
	int i;
	struct tm *ltime;

	file = filep->file;

	// try to determine local time
	ltime = localtime(&file->time_write);
	time_to_dos(ltime, &file->date, &file->time);

	// lumpfile = source file
	lumpfile = fopen(file->path, "rb");
	if (lumpfile == NULL)
	{
		fprintf(stderr, "Could not open %s: %s\n", file->path, strerror(errno));
		return 1;
	}
	// len = source size
	fseek (lumpfile, 0, SEEK_END);
	len = ftell(lumpfile);
	fseek (lumpfile, 0, SEEK_SET);

	// allocate a buffer for the whole source file
	readbuf = malloc(len);
	if (readbuf == NULL)
	{
		fclose(lumpfile);
		fprintf(stderr, "Could not allocate %u bytes\n", (int)len);
		return 1;
	}
	// read the whole source file into buffer
	readlen = (unsigned int)fread(readbuf, 1, len, lumpfile);
	fclose(lumpfile);

	// if read less bytes than expected, 
	if (readlen != len)
	{
		// diagnose and return error
		free(readbuf);
		fprintf(stderr, "Unable to read %s\n", file->path);
		return 1;
	}
	// file loaded

	file->uncompressed_size = len;
	file->compressed_size = len;
	file->method = METHOD_STORED;

	// Calculate CRC32 for file.
	crc = crc32(0, NULL, 0);
	crc = crc32(crc, readbuf, (uInt)len);
	file->crc32 = LittleLong(crc);

	// Can we save time and just copy the file from the old zip?
	if (odir != NULL && ozip != NULL)
	{
		CentralDirectoryEntry *dirent;

		dirent = find_file_in_zip(odir, filep->path_in_zip, len, crc, file->date, file->time);
		if (dirent != NULL)
		{
			i = copy_zip_file(zip_file, file, ozip, dirent);
			if (i > 0)
			{
				free(readbuf);
				return 0;
			}
			if (i < 0)
			{
				free(readbuf);
				fprintf(stderr, "Unable to write %s to zip\n", file->path);
				return 1;
			}
		}
	}

	if (!Quiet)
	{
		if (ozip != NULL)
		{
			printf("Updating %-40s", filep->path_in_zip);
		}
		else
		{
			printf("Adding %-40s", filep->path_in_zip);
		}
	}
	UpdateCount++;

	// Allocate a buffer for compression, one byte less than the source buffer.
	// If it doesn't fit in that space, then skip compression and store it as-is.
	compbuf[0] = malloc(len - 1);
	compbuf[1] = malloc(len - 1);
	best = -1;	// best slot
	slot = 0;	// slot we are compressing to now

	// Find best compression method. We have two output buffers. One to hold the
	// best compression method, and the other to hold the compression we are trying
	// now.
	for (i = 0; Compressors[i].compress != NULL; ++i)
	{
		if (DeflateOnly && Compressors[i].method != METHOD_DEFLATE)
		{
			continue;
		}
		comp_len[slot] = len - 1;
		method[slot] = Compressors[i].method;
		offset[slot] = Compressors[i].compress(compbuf[slot], &comp_len[slot], readbuf, len);
		if (offset[slot] >= 0)
		{
			if (best < 0 || comp_len[slot] <= comp_len[best])
			{
				best = slot;
				slot ^= 1;
			}
		}
	}

	if (best >= 0)
	{
		file->method = method[best];
		file->compressed_size = comp_len[best];
	}
//	printf("%s -> method %d -> slot %d\n", filep->path_in_zip, file->method, best);

	// Fill in local directory header.
	local.Magic = ZIP_LOCALFILE;
	local.VersionToExtract[0] = method_to_version(file->method);
	local.VersionToExtract[1] = 0;
	local.Flags = file->method == METHOD_DEFLATE ? LittleShort(2) : 0;
	local.Method = LittleShort(file->method);
	local.ModTime = file->time;
	local.ModDate = file->date;
	local.CRC32 = file->crc32;
	local.UncompressedSize = LittleLong(file->uncompressed_size);
	local.CompressedSize = LittleLong(file->compressed_size);
	local.NameLength = LittleShort((unsigned short)strlen(filep->path_in_zip));
	local.ExtraLength = 0;

	file->zip_offset = ftell(zip_file);

	// Write out the header, file name, and file data.
	if (fwrite(&local, sizeof(local), 1, zip_file) != 1 ||
		fwrite(filep->path_in_zip, strlen(filep->path_in_zip), 1, zip_file) != 1 ||
		(file->method ? fwrite(compbuf[best] + offset[best], 1, comp_len[best], zip_file) != comp_len[best] :
						fwrite(readbuf, 1, len, zip_file) != len))
	{
		if (!Quiet)
		{
			printf("\n");
		}
		fprintf(stderr, "Unable to write %s to zip\n", file->path);
		free(readbuf);
		if (compbuf[0] != NULL)
		{
			free(compbuf[0]);
		}
		if (compbuf[1] != NULL)
		{
			free(compbuf[1]);
		}
		return 1;
	}

	// all done
	free(readbuf);
	if (compbuf[0] != NULL)
	{
		free(compbuf[0]);
	}
	if (compbuf[1] != NULL)
	{
		free(compbuf[1]);
	}
	if (!Quiet)
	{
		printf("%5.1f%% [%6u/%6u] %s\n", 100.0 - 100.0 * file->compressed_size / file->uncompressed_size,
			file->compressed_size, file->uncompressed_size, method_name(file->method));
	}
	return 0;
}